

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Opnd *opnd)

{
  OpndKind OVar1;
  SymOpnd *pSVar2;
  
  if (opnd != (Opnd *)0x0) {
    OVar1 = IR::Opnd::GetKind(opnd);
    if (OVar1 == OpndKindReg) {
      pSVar2 = (SymOpnd *)IR::Opnd::AsRegOpnd(opnd);
    }
    else {
      if (OVar1 != OpndKindSym) {
        return val;
      }
      pSVar2 = IR::Opnd::AsSymOpnd(opnd);
    }
    if (pSVar2->m_sym != (Sym *)0x0) {
      SetValue(this,val,pSVar2->m_sym);
    }
  }
  return val;
}

Assistant:

Value *
GlobOptBlockData::SetValue(Value *val, IR::Opnd *opnd)
{
    if (opnd)
    {
        Sym *sym;
        switch (opnd->GetKind())
        {
        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            break;

        case IR::OpndKindReg:
            sym = opnd->AsRegOpnd()->m_sym;
            break;

        default:
            sym = nullptr;
        }
        if (sym)
        {
            this->SetValue(val, sym);
        }
    }

    return val;
}